

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O0

void crnlib::image_utils::convert_image(image_u8 *img,conversion_type conv_type)

{
  color_quad_u8 cVar1;
  bool bVar2;
  component_flags cVar3;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar4;
  int iVar5;
  color_quad<unsigned_char,_int> *pcVar6;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_24;
  undefined1 local_20;
  undefined1 local_1f;
  uint8 y_2;
  uint8 y_1;
  color_quad_u8 dst;
  color_quad_u8 src;
  uint x;
  uint y;
  conversion_type conv_type_local;
  image_u8 *img_local;
  
  switch(conv_type) {
  case cConversion_To_CCxY:
    image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags
              (img,cCompFlagLumaChroma|cCompFlagAValid|cCompFlagGValid|cCompFlagRValid);
    break;
  case cConversion_From_CCxY:
    image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags
              (img,cCompFlagBValid|cCompFlagGValid|cCompFlagRValid);
    break;
  case cConversion_To_xGxR:
    image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags
              (img,cCompFlagNormalMap|cCompFlagAValid|cCompFlagGValid);
    break;
  case cConversion_From_xGxR:
    image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags
              (img,cCompFlagNormalMap|cCompFlagBValid|cCompFlagGValid|cCompFlagRValid);
    break;
  case cConversion_To_xGBR:
    image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags
              (img,cCompFlagNormalMap|cCompFlagAValid|cCompFlagBValid|cCompFlagGValid);
    break;
  case cConversion_From_xGBR:
    image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags
              (img,cCompFlagNormalMap|cCompFlagBValid|cCompFlagGValid|cCompFlagRValid);
    break;
  case cConversion_To_AGBR:
    image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags
              (img,cCompFlagNormalMap|cDefaultCompFlags);
    break;
  case cConversion_From_AGBR:
    image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags
              (img,cCompFlagNormalMap|cDefaultCompFlags);
    break;
  case cConversion_XY_to_XYZ:
    image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags
              (img,cCompFlagNormalMap|cCompFlagBValid|cCompFlagGValid|cCompFlagRValid);
    break;
  case cConversion_Y_To_A:
    cVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_comp_flags(img);
    image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags(img,cVar3 | cCompFlagAValid);
    break;
  case cConversion_A_To_RGBA:
    image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags(img,cDefaultCompFlags);
    break;
  case cConversion_Y_To_RGB:
    bVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::has_alpha(img);
    cVar3 = 0;
    if (bVar2) {
      cVar3 = cCompFlagAValid;
    }
    image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags
              (img,cVar3 | (cCompFlagGrayscale|cCompFlagBValid|cCompFlagGValid|cCompFlagRValid));
    break;
  case cConversion_To_Y:
    cVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_comp_flags(img);
    image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags(img,cVar3 | cCompFlagGrayscale);
    break;
  default:
    goto switchD_0012c432_default;
  }
  for (src.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                     (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
                      )0x0;
      aVar4.m_u32 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(img),
      (uint)src.field_0 < aVar4.m_u32;
      src.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                    ((int)src.field_0 + 1)) {
    for (dst.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                       (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
                        )0x0; cVar1.field_0 = dst.field_0,
        aVar4.m_u32 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(img),
        (uint)cVar1.field_0 < aVar4.m_u32;
        dst.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                      ((int)dst.field_0 + 1)) {
      pcVar6 = image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                         (img,(uint)dst.field_0,(uint)src.field_0);
      color_quad<unsigned_char,_int>::color_quad
                ((color_quad<unsigned_char,_int> *)&stack0xffffffffffffffe0,pcVar6);
      color_quad<unsigned_char,_int>::color_quad
                ((color_quad<unsigned_char,_int> *)&local_24.field_0);
      switch(conv_type) {
      case cConversion_To_CCxY:
        crnlib::color::RGB_to_YCC
                  ((color_quad_u8 *)&local_24.field_0,(color_quad_u8 *)&stack0xffffffffffffffe0,0x7b
                   ,0x7d);
        break;
      case cConversion_From_CCxY:
        crnlib::color::YCC_to_RGB
                  ((color_quad_u8 *)&local_24.field_0,(color_quad_u8 *)&stack0xffffffffffffffe0,0x7b
                   ,0x7d);
        break;
      case cConversion_To_xGxR:
        local_24.field_0.r = 0;
        local_24.field_0.g = local_1f;
        local_24.field_0.b = 0;
        local_24.field_0.a = local_20;
        break;
      case cConversion_From_xGxR:
        local_24.field_0.r = y_1;
        local_24.field_0.g = local_1f;
        local_24.field_0.b = regen_z((uint)y_1,(uint)(byte)local_1f);
        local_24.field_0.a = 0xff;
        break;
      case cConversion_To_xGBR:
        local_24.field_0.r = 0;
        local_24.field_0.g = local_1f;
        local_24.field_0.b = y_2;
        local_24.field_0.a = local_20;
        break;
      case cConversion_From_xGBR:
        local_24.field_0.r = y_1;
        local_24.field_0.g = local_1f;
        local_24.field_0.b = y_2;
        local_24.field_0.a = 0xff;
        break;
      case cConversion_To_AGBR:
        local_24.field_0.r = y_1;
        local_24.field_0.g = local_1f;
        local_24.field_0.b = y_2;
        local_24.field_0.a = local_20;
        break;
      case cConversion_From_AGBR:
        local_24.field_0.r = y_1;
        local_24.field_0.g = local_1f;
        local_24.field_0.b = y_2;
        local_24.field_0.a = local_20;
        break;
      case cConversion_XY_to_XYZ:
        local_24.field_0.r = local_20;
        local_24.field_0.g = local_1f;
        local_24.field_0.b = regen_z((uint)(byte)local_20,(uint)(byte)local_1f);
        local_24.field_0.a = 0xff;
        break;
      case cConversion_Y_To_A:
        local_24.field_0.r = local_20;
        local_24.field_0.g = local_1f;
        local_24.field_0.b = y_2;
        iVar5 = color_quad<unsigned_char,_int>::get_luma
                          ((color_quad<unsigned_char,_int> *)&stack0xffffffffffffffe0);
        local_24.field_0.a = (uchar)iVar5;
        break;
      case cConversion_A_To_RGBA:
        local_24.field_0.r = y_1;
        local_24.field_0.g = y_1;
        local_24.field_0.b = y_1;
        local_24.field_0.a = y_1;
        break;
      case cConversion_Y_To_RGB:
        iVar5 = color_quad<unsigned_char,_int>::get_luma
                          ((color_quad<unsigned_char,_int> *)&stack0xffffffffffffffe0);
        local_24.field_0.r = (uchar)iVar5;
        local_24.field_0.a = y_1;
        local_24.field_0.g = local_24.field_0.r;
        local_24.field_0.b = local_24.field_0.r;
        break;
      case cConversion_To_Y:
        iVar5 = color_quad<unsigned_char,_int>::get_luma
                          ((color_quad<unsigned_char,_int> *)&stack0xffffffffffffffe0);
        local_24.field_0.r = (uchar)iVar5;
        local_24.field_0.a = y_1;
        local_24.field_0.g = local_24.field_0.r;
        local_24.field_0.b = local_24.field_0.r;
        break;
      default:
        color_quad<unsigned_char,_int>::operator=
                  ((color_quad<unsigned_char,_int> *)&local_24.field_0,
                   (color_quad<unsigned_char,_int> *)&stack0xffffffffffffffe0);
      }
      pcVar6 = image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                         (img,(uint)dst.field_0,(uint)src.field_0);
      color_quad<unsigned_char,_int>::operator=
                (pcVar6,(color_quad<unsigned_char,_int> *)&local_24.field_0);
    }
  }
switchD_0012c432_default:
  return;
}

Assistant:

void convert_image(image_u8& img, image_utils::conversion_type conv_type)
        {
            switch (conv_type)
            {
            case image_utils::cConversion_To_CCxY:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagAValid | pixel_format_helpers::cCompFlagLumaChroma));
                break;
            }
            case image_utils::cConversion_From_CCxY:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid));
                break;
            }
            case image_utils::cConversion_To_xGxR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagAValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_From_xGxR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_To_xGBR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagAValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_To_AGBR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagAValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_From_xGBR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_From_AGBR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagAValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_XY_to_XYZ:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case cConversion_Y_To_A:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(img.get_comp_flags() | pixel_format_helpers::cCompFlagAValid));
                break;
            }
            case cConversion_A_To_RGBA:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagAValid));
                break;
            }
            case cConversion_Y_To_RGB:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagGrayscale | (img.has_alpha() ? pixel_format_helpers::cCompFlagAValid : 0)));
                break;
            }
            case cConversion_To_Y:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(img.get_comp_flags() | pixel_format_helpers::cCompFlagGrayscale));
                break;
            }
            default:
            {
                CRNLIB_ASSERT(false);
                return;
            }
            }

            for (uint y = 0; y < img.get_height(); y++)
            {
                for (uint x = 0; x < img.get_width(); x++)
                {
                    color_quad_u8 src(img(x, y));
                    color_quad_u8 dst;

                    switch (conv_type)
                    {
                    case image_utils::cConversion_To_CCxY:
                    {
                        color::RGB_to_YCC(dst, src);
                        break;
                    }
                    case image_utils::cConversion_From_CCxY:
                    {
                        color::YCC_to_RGB(dst, src);
                        break;
                    }
                    case image_utils::cConversion_To_xGxR:
                    {
                        dst.r = 0;
                        dst.g = src.g;
                        dst.b = 0;
                        dst.a = src.r;
                        break;
                    }
                    case image_utils::cConversion_From_xGxR:
                    {
                        dst.r = src.a;
                        dst.g = src.g;
                        // This is kinda iffy, we're assuming the image is a normal map here.
                        dst.b = regen_z(src.a, src.g);
                        dst.a = 255;
                        break;
                    }
                    case image_utils::cConversion_To_xGBR:
                    {
                        dst.r = 0;
                        dst.g = src.g;
                        dst.b = src.b;
                        dst.a = src.r;
                        break;
                    }
                    case image_utils::cConversion_To_AGBR:
                    {
                        dst.r = src.a;
                        dst.g = src.g;
                        dst.b = src.b;
                        dst.a = src.r;
                        break;
                    }
                    case image_utils::cConversion_From_xGBR:
                    {
                        dst.r = src.a;
                        dst.g = src.g;
                        dst.b = src.b;
                        dst.a = 255;
                        break;
                    }
                    case image_utils::cConversion_From_AGBR:
                    {
                        dst.r = src.a;
                        dst.g = src.g;
                        dst.b = src.b;
                        dst.a = src.r;
                        break;
                    }
                    case image_utils::cConversion_XY_to_XYZ:
                    {
                        dst.r = src.r;
                        dst.g = src.g;
                        // This is kinda iffy, we're assuming the image is a normal map here.
                        dst.b = regen_z(src.r, src.g);
                        dst.a = 255;
                        break;
                    }
                    case image_utils::cConversion_Y_To_A:
                    {
                        dst.r = src.r;
                        dst.g = src.g;
                        dst.b = src.b;
                        dst.a = static_cast<uint8>(src.get_luma());
                        break;
                    }
                    case image_utils::cConversion_Y_To_RGB:
                    {
                        uint8 y = static_cast<uint8>(src.get_luma());
                        dst.r = y;
                        dst.g = y;
                        dst.b = y;
                        dst.a = src.a;
                        break;
                    }
                    case image_utils::cConversion_A_To_RGBA:
                    {
                        dst.r = src.a;
                        dst.g = src.a;
                        dst.b = src.a;
                        dst.a = src.a;
                        break;
                    }
                    case image_utils::cConversion_To_Y:
                    {
                        uint8 y = static_cast<uint8>(src.get_luma());
                        dst.r = y;
                        dst.g = y;
                        dst.b = y;
                        dst.a = src.a;
                        break;
                    }
                    default:
                    {
                        CRNLIB_ASSERT(false);
                        dst = src;
                        break;
                    }
                    }

                    img(x, y) = dst;
                }
            }
        }